

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O0

int __thiscall RenderTarget::init(RenderTarget *this,EVP_PKEY_CTX *ctx)

{
  GLuint GVar1;
  int number;
  nite *this_00;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  CreateProxy local_11;
  RenderTarget *pRStack_10;
  CreateProxy renRTZoom;
  RenderTarget *this_local;
  
  pRStack_10 = this;
  (*__glewGenFramebuffers)(1,&this->objectId);
  (*__glewBindFramebuffer)(0x8ca9,this->objectId);
  GVar1 = createTexture((int)(::size.x * targetExcess),(int)(::size.y * targetExcess));
  this->texture = GVar1;
  (*__glewFramebufferTexture2D)(0x8d40,0x8ce0,0xde1,this->texture,0);
  this_00 = (nite *)(ulong)(uint)RTcount;
  RTcount = RTcount + 1;
  nite::toStr_abi_cxx11_(&local_58,this_00,number);
  std::operator+(&local_38,"ren_zoom",&local_58);
  nite::Console::CreateProxy::CreateProxy(&local_11,&local_38,1,4,&this->Zoom);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  (*__glewBindFramebuffer)(0x8d40,0);
  this->minZoom = 25.0;
  this->angle = 0.0;
  this->Zoom = 100.0;
  this->realZoom = this->Zoom;
  ::target = 0;
  this->smooth = true;
  return (int)this;
}

Assistant:

void init(){
		/* Create framebuffer for the scene */
		glGenFramebuffers(1, &objectId);
		glBindFramebuffer(GL_DRAW_FRAMEBUFFER, objectId);
		/* Create texture and attach it to the framebuffer */
		texture = createTexture(size.x * targetExcess, size.y * targetExcess);
		/* Attach it to the freambuffer */
		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texture, 0);

		/* Get status */
		// GLenum Status;
		// Status = glCheckFramebufferStatusEXT(GL_FRAMEBUFFER_EXT);
		// if (Status != GL_FRAMEBUFFER_COMPLETE_EXT) Error = Status;
		/* Switch back to the window framebuffer */
		nite::Console::CreateProxy renRTZoom("ren_zoom"+nite::toStr(RTcount++), nite::Console::ProxyType::Float, sizeof(Zoom), &Zoom);
		glBindFramebuffer(GL_FRAMEBUFFER, 0);
		minZoom = 25;
		angle 	= 0;
		Zoom 		= 100;
		realZoom= Zoom;
		target	= 0;
		smooth 	= true;
	}